

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O2

ImfTiledOutputFile *
ImfOpenTiledOutputFile
          (char *name,ImfHeader *hdr,int channels,int xSize,int ySize,int mode,int rmode)

{
  int numThreads;
  TiledRgbaOutputFile *this;
  
  this = (TiledRgbaOutputFile *)operator_new(0x18);
  numThreads = Imf_3_4::globalThreadCount();
  Imf_3_4::TiledRgbaOutputFile::TiledRgbaOutputFile
            (this,name,(Header *)hdr,channels,xSize,ySize,mode,rmode,numThreads);
  return (ImfTiledOutputFile *)this;
}

Assistant:

ImfTiledOutputFile*
ImfOpenTiledOutputFile (
    const char       name[],
    const ImfHeader* hdr,
    int              channels,
    int              xSize,
    int              ySize,
    int              mode,
    int              rmode)
{
    try
    {
        return (ImfTiledOutputFile*) new OPENEXR_IMF_INTERNAL_NAMESPACE::
            TiledRgbaOutputFile (
                name,
                *header (hdr),
                OPENEXR_IMF_INTERNAL_NAMESPACE::RgbaChannels (channels),
                xSize,
                ySize,
                OPENEXR_IMF_INTERNAL_NAMESPACE::LevelMode (mode),
                OPENEXR_IMF_INTERNAL_NAMESPACE::LevelRoundingMode (rmode));
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}